

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port_signature_map_entry.c
# Opt level: O0

apx_portSignatureMapEntry_t * apx_portSignatureMapEntry_new(void)

{
  apx_portSignatureMapEntry_t *self_00;
  apx_portSignatureMapEntry_t *self;
  
  self_00 = (apx_portSignatureMapEntry_t *)malloc(0x48);
  if (self_00 != (apx_portSignatureMapEntry_t *)0x0) {
    apx_portSignatureMapEntry_create(self_00);
  }
  return self_00;
}

Assistant:

apx_portSignatureMapEntry_t *apx_portSignatureMapEntry_new(void)
{
   apx_portSignatureMapEntry_t *self = (apx_portSignatureMapEntry_t*) malloc(sizeof(apx_portSignatureMapEntry_t));
   if(self != NULL)
   {
      apx_portSignatureMapEntry_create(self);
   }
   return self;
}